

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial_device.cpp
# Opt level: O2

bool device_pick(float x,float y,ISPCCamera *camera,Vec3fa *hitPos)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  Ray1 ray;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  undefined8 local_34;
  
  fStack_70 = (float)(int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_78 = (undefined1  [8])*(undefined8 *)&(camera->xfm).p.field_0;
  fVar7 = (camera->xfm).l.vy.field_0.field_0.x * y + (camera->xfm).l.vx.field_0.field_0.x * x +
          (camera->xfm).l.vz.field_0.field_0.x;
  uVar1 = *(undefined8 *)((long)&(camera->xfm).l.vx.field_0 + 4);
  uVar2 = *(undefined8 *)((long)&(camera->xfm).l.vy.field_0 + 4);
  uVar3 = *(undefined8 *)((long)&(camera->xfm).l.vz.field_0 + 4);
  fVar5 = y * (float)uVar2 + (float)uVar1 * x + (float)uVar3;
  fVar6 = y * (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20) * x +
          (float)((ulong)uVar3 >> 0x20);
  fVar4 = fVar7 * fVar7 + fVar5 * fVar5 + fVar6 * fVar6;
  auVar9 = rsqrtss(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
  fVar8 = auVar9._0_4_;
  fVar4 = fVar8 * fVar8 * fVar4 * -0.5 * fVar8 + fVar8 * 1.5;
  local_68._4_4_ = fVar4 * fVar5;
  local_68._0_4_ = fVar7 * fVar4;
  fStack_60 = fVar4 * fVar6;
  fStack_6c = 0.0;
  local_58 = 0xffffffff7f800000;
  local_34 = 0xffffffffffffffff;
  fStack_5c = g_debug;
  rtcIntersect1(embree::g_scene,local_78,0);
  fVar4 = 0.0;
  fVar5 = 0.0;
  fVar6 = 0.0;
  fVar7 = 0.0;
  if (local_34._4_4_ != -1) {
    fVar4 = (float)local_58 * (float)local_68._0_4_ + (float)local_78._0_4_;
    fVar5 = (float)local_58 * (float)local_68._4_4_ + (float)local_78._4_4_;
    fVar6 = (float)local_58 * fStack_60 + fStack_70;
    fVar7 = (float)local_58 * fStack_5c + fStack_6c;
  }
  (hitPos->field_0).m128[0] = fVar4;
  (hitPos->field_0).m128[1] = fVar5;
  (hitPos->field_0).m128[2] = fVar6;
  (hitPos->field_0).m128[3] = fVar7;
  return local_34._4_4_ != -1;
}

Assistant:

bool device_pick(const float x,
                            const float y,
                            const ISPCCamera& camera,
                            Vec3fa& hitPos)
{
  /* initialize ray */
  Ray1 ray;
  ray.org = Vec3ff(camera.xfm.p);
  ray.dir = Vec3ff(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz));
  ray.tnear() = 0.0f;
  ray.tfar = inf;
  ray.geomID = RTC_INVALID_GEOMETRY_ID;
  ray.primID = RTC_INVALID_GEOMETRY_ID;
  ray.mask = -1;
  ray.time() = g_debug;

  /* intersect ray with scene */
#if defined(__SYCL_DEVICE_ONLY__)
  rtcTraversableIntersect1(g_traversable,RTCRayHit1_(ray));
#else
  rtcIntersect1(g_scene,RTCRayHit1_(ray));
#endif

  /* shade pixel */
  if (ray.geomID == RTC_INVALID_GEOMETRY_ID) {
    hitPos = Vec3fa(0.0f,0.0f,0.0f);
    return false;
  }
  else {
    hitPos = ray.org + ray.tfar*ray.dir;
    return true;
  }
}